

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookupTable.h
# Opt level: O0

IDTy __thiscall dg::PointerIDLookupTable::get(PointerIDLookupTable *this,Pointer *ptr)

{
  bool bVar1;
  pointer pvVar2;
  const_iterator it2;
  const_iterator it;
  unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_dg::Offset,_unsigned_long>,_true> local_38;
  _Node_iterator_base<std::pair<const_dg::Offset,_unsigned_long>,_true> local_30;
  _Node_iterator_base<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_false>
  local_20 [3];
  unsigned_long local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x1631e2);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_false,_false>
                  *)0x163220);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<dg::Offset,_unsigned_long,_std::hash<dg::Offset>,_std::equal_to<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>_>
         ::find((unordered_map<dg::Offset,_unsigned_long,_std::hash<dg::Offset>,_std::equal_to<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>_>
                 *)in_stack_ffffffffffffffb8,(key_type *)0x163235);
    std::__detail::
    _Node_const_iterator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_false,_false>
                  *)0x163244);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<dg::Offset,_unsigned_long,_std::hash<dg::Offset>,_std::equal_to<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>_>
         ::end((unordered_map<dg::Offset,_unsigned_long,_std::hash<dg::Offset>,_std::equal_to<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>_>
                *)in_stack_ffffffffffffffb8);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      local_8 = 0;
    }
    else {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_dg::Offset,_unsigned_long>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_dg::Offset,_unsigned_long>,_false,_true>
                           *)0x16327f);
      local_8 = pvVar2->second;
    }
  }
  return local_8;
}

Assistant:

IDTy get(const Pointer &ptr) const {
        auto it = _ptrToID.find(ptr.target);
        if (it == _ptrToID.end()) {
            return 0; // invalid ID
        }
        auto it2 = it->second.find(ptr.offset);
        if (it2 == it->second.end())
            return 0;
        return it2->second;
    }